

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_log_post(ma_log *pLog,ma_uint32 level,char *pMessage)

{
  uint uVar1;
  ma_result mVar2;
  ulong uVar3;
  void **ppvVar4;
  
  mVar2 = MA_INVALID_ARGS;
  if (pMessage != (char *)0x0 && pLog != (ma_log *)0x0) {
    uVar1 = pLog->callbackCount;
    if (uVar1 != 0) {
      ppvVar4 = &pLog->callbacks[0].pUserData;
      uVar3 = 0;
      do {
        if (((ma_log_callback *)(ppvVar4 + -1))->onLog != (ma_log_callback_proc)0x0) {
          (*((ma_log_callback *)(ppvVar4 + -1))->onLog)(*ppvVar4,level,pMessage);
          uVar1 = pLog->callbackCount;
        }
        uVar3 = uVar3 + 1;
        ppvVar4 = ppvVar4 + 2;
      } while (uVar3 < uVar1);
    }
    mVar2 = MA_SUCCESS;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_log_post(ma_log* pLog, ma_uint32 level, const char* pMessage)
{
    if (pLog == NULL || pMessage == NULL) {
        return MA_INVALID_ARGS;
    }

    ma_log_lock(pLog);
    {
        ma_uint32 iLog;
        for (iLog = 0; iLog < pLog->callbackCount; iLog += 1) {
            if (pLog->callbacks[iLog].onLog) {
                pLog->callbacks[iLog].onLog(pLog->callbacks[iLog].pUserData, level, pMessage);
            }
        }
    }
    ma_log_unlock(pLog);

    return MA_SUCCESS;
}